

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void drwav_f32_to_s16(drwav_int16 *pOut,float *pIn,size_t sampleCount)

{
  float fVar1;
  size_t i;
  ushort uVar2;
  float fVar3;
  
  for (i = 0; sampleCount != i; i = i + 1) {
    fVar1 = pIn[i];
    uVar2 = 0x8000;
    if (-1.0 <= fVar1) {
      fVar3 = 1.0;
      if (fVar1 <= 1.0) {
        fVar3 = fVar1;
      }
      uVar2 = (ushort)(int)((fVar3 + 1.0) * 32767.5) ^ 0x8000;
    }
    pOut[i] = uVar2;
  }
  return;
}

Assistant:

void drwav_f32_to_s16(drwav_int16* pOut, const float* pIn, size_t sampleCount) {
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        float x = pIn[i];
        float c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5f);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}